

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdi.cpp
# Opt level: O2

bool ReadFDI(MemFile *file,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  char extraout_AL;
  bool bVar4;
  byte new_dam;
  uint16_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  ssize_t sVar9;
  mapped_type *pmVar10;
  exception *peVar11;
  byte bVar12;
  uint sector_00;
  size_t in_RCX;
  size_t __nbytes;
  uint uVar13;
  uint uVar14;
  uint size_00;
  uint8_t size;
  uint size_01;
  bool bVar15;
  FDI_SECTOR fs;
  CRC16 crc;
  char *local_128;
  uint local_120;
  FDI_TRACK ft;
  Data data;
  CylHead cylhead;
  undefined8 local_d0;
  int sector_size;
  int sector_pos;
  uint local_a4;
  FDI_HEADER fh;
  Track track;
  Sector sector;
  
  MemFile::rewind(file,(FILE *)disk);
  if (extraout_AL != '\0') {
    sVar9 = MemFile::read(file,(int)&fh,(void *)0xe,in_RCX);
    if ((char)sVar9 != '\0') {
      iVar6 = bcmp(&fh,"FDI",3);
      uVar14 = 0;
      if (iVar6 != 0) goto LAB_00191068;
      __nbytes = 0x200;
      Format::Validate((uint)fh.bTracks[0],(uint)fh.bSides[0],1,0x200,0);
      uVar7 = (uint)(ushort)fh.bDataOffset;
      MemFile::seek(file,(ushort)fh.bExtraSize + 0xe);
      for (; uVar14 != fh.bTracks[0]; uVar14 = uVar14 + 1) {
        uVar13 = 0;
        while (uVar13 != fh.bSides[0]) {
          local_120 = uVar13;
          CylHead::CylHead(&cylhead,uVar14,uVar13);
          Track::Track(&track,0);
          sVar9 = MemFile::read(file,(int)&ft,(void *)0x7,__nbytes);
          if ((char)sVar9 == '\0') {
            peVar11 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[20],CylHead&>
                      (peVar11,(char (*) [20])"short file reading ",&cylhead);
LAB_001912ea:
            __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          if (0x90 < ft.sectors) {
            peVar11 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<CylHead&,char_const(&)[24],unsigned_char&,char_const(&)[2]>
                      (peVar11,&cylhead,(char (*) [24])" has too many sectors (",&ft.sectors,
                       (char (*) [2])0x1a9e10);
            goto LAB_001912ea;
          }
          uVar13 = (uint)(uint3)ft.abTrackOffset._0_3_;
          __nbytes = 0;
          while( true ) {
            sector_00 = (uint)__nbytes;
            local_a4 = sector_00;
            if (ft.sectors <= sector_00) break;
            sVar9 = MemFile::read(file,(int)&fs,(void *)0x7,__nbytes);
            if ((char)sVar9 == '\0') {
              peVar11 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[15],int&>
                        (peVar11,(char (*) [20])"short file reading ",&cylhead,
                         (char (*) [15])" sector index ",(int *)&local_a4);
              __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            Header::Header((Header *)&data,(uint)fs.bTrack,(uint)fs.bSide,(uint)fs.bSector,
                           (uint)fs.bSize);
            Sector::Sector(&sector,_250K,MFM,(Header *)&data,0);
            uVar2 = fs.bFlags;
            bVar15 = -1 < (char)fs.bFlags;
            iVar6 = MemFile::tell(file);
            sector_pos = (uint)(ushort)fs.bSectorOffset + uVar13 + uVar7;
            bVar4 = MemFile::seek(file,sector_pos);
            if (!bVar4) {
              peVar11 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::
              exception<char_const(&)[19],CylHead&,char_const(&)[9],unsigned_char&,char_const(&)[8],int&>
                        (peVar11,(char (*) [19])"failed to seek to ",&cylhead,(char (*) [9])0x1abda3
                         ,&fs.bSector,(char (*) [8])" data @",&sector_pos);
              __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            size_00 = fs.bSize & 3;
            sector_size = Sector::SizeCodeToLength(size_00);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                       (long)sector_size,(allocator_type *)&local_128);
            MemFile::read(file,(int)data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                    .
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,(void *)0x1,
                          (ulong)(uint)((int)data.
                                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                             .
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                       (int)data.
                                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                            .
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start));
            MemFile::seek(file,iVar6);
            new_dam = bVar15 * '\x03' | 0xf8;
            bVar4 = true;
            for (size_01 = 0; ((uVar2 & 0x40) == 0 && (size_01 < 4)); size_01 = size_01 + 1) {
              iVar6 = Sector::SizeCodeToLength(size_01);
              iVar8 = Sector::SizeCodeToLength((uint)fs.bSize);
              bVar12 = (byte)size_01;
              if (iVar6 == iVar8) {
                bVar12 = (byte)(1 << (bVar12 & 0x1f));
                bVar4 = (bool)(bVar4 & (fs.bFlags >> (size_01 & 0x1f) & 1) == 0);
LAB_00190f81:
                fs.bFlags = ~bVar12 & fs.bFlags;
              }
              else if (size_01 <= size_00) {
                CRC16::CRC16(&crc,0xcdb4);
                CRC16::add(&crc,(uint)new_dam);
                CRC16::add(&crc,data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,(long)iVar6);
                if (size_00 == size_01) {
                  if ((1 << (sbyte)size_00 & (uint)fs.bFlags) != 0) {
                    uVar5 = CRC16::operator_cast_to_unsigned_short(&crc);
                    local_128._0_1_ = SUB21(uVar5 >> 8,0);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>
                              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                               (uchar *)&local_128);
                    uVar5 = CRC16::operator_cast_to_unsigned_short(&crc);
                    local_128 = (char *)CONCAT71(local_128._1_7_,(char)uVar5);
                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                    emplace_back<unsigned_char>
                              (&data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                               (uchar *)&local_128);
                  }
                }
                else {
                  CRC16::add(&crc,data.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start + iVar6,2);
                  uVar3 = fs.bFlags;
                  uVar5 = CRC16::operator_cast_to_unsigned_short(&crc);
                  if (((uVar5 != 0 ^ uVar3 >> (bVar12 & 0x1f)) & 1) == 0) {
                    local_128 = CHR(uVar14,local_120,(uint)fs.bSector);
                    Message<int&,char_const*>
                              (msgWarning,"inconsistent CRC flag for size=%d for %s",&sector_size,
                               &local_128);
                  }
                }
                bVar12 = (byte)(1 << (bVar12 & 0x1f));
                goto LAB_00190f81;
              }
            }
            if ((fs.bFlags & 0x3f) != 0) {
              local_128 = CHSR(uVar14,local_120,sector_00,(uint)fs.bSector);
              Message<unsigned_char&,char_const*>
                        (msgWarning,"unexpected flags (%02X) on %s",&fs.bFlags,&local_128);
            }
            Sector::add(&sector,&data,bVar4,new_dam);
            Track::add(&track,&sector);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
            std::vector<Data,_std::allocator<Data>_>::~vector(&sector.m_data);
            __nbytes = (size_t)(sector_00 + 1);
          }
          Disk::write((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                      (int)&cylhead,&track,__nbytes);
          std::vector<Sector,_std::allocator<Sector>_>::~vector(&track.m_sectors);
          uVar13 = local_120 + 1;
        }
      }
      if (fh.bDescOffset != (uint8_t  [2])0x0) {
        uVar14 = (uint)(ushort)fh.bDescOffset;
        bVar4 = MemFile::seek(file,uVar14);
        if (bVar4) {
          iVar6 = 0x100;
          if (uVar14 <= uVar7 && uVar7 - uVar14 != 0) {
            iVar6 = uVar7 - uVar14;
          }
          std::vector<char,_std::allocator<char>_>::vector
                    ((vector<char,_std::allocator<char>_> *)&cylhead,(long)iVar6,
                     (allocator_type *)&sector);
          bVar4 = MemFile::read<std::vector<char,std::allocator<char>>>
                            (file,(vector<char,_std::allocator<char>_> *)&cylhead);
          if (!bVar4) {
            peVar11 = (exception *)__cxa_allocate_exception(0x10);
            util::exception::exception<char_const(&)[27]>
                      (peVar11,(char (*) [27])"short file reading comment");
            __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
          }
          sector.header._0_8_ = &sector.datarate;
          std::__cxx11::string::_M_construct<char_const*>((string *)&sector,cylhead,local_d0);
          std::__cxx11::string::substr((ulong)&track,(ulong)&sector);
          bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&track,"\r\n\'This file created by TDCVT");
          if (bVar4) {
            std::__cxx11::string::substr((ulong)&data,(ulong)&sector);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&data,"FDI");
            std::__cxx11::string::~string((string *)&data);
            std::__cxx11::string::~string((string *)&track);
            if (bVar4) {
              peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&track,"comment",(allocator<char> *)&data);
              pmVar10 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator[](&peVar1->metadata,(key_type *)&track);
              std::__cxx11::string::_M_assign((string *)pmVar10);
              goto LAB_001911b9;
            }
          }
          else {
LAB_001911b9:
            std::__cxx11::string::~string((string *)&track);
          }
          std::__cxx11::string::~string((string *)&sector);
          std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                    ((_Vector_base<char,_std::allocator<char>_> *)&cylhead);
        }
      }
      std::__cxx11::string::assign
                ((char *)&((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                          strType);
      uVar14 = 1;
      goto LAB_00191068;
    }
  }
  uVar14 = 0;
LAB_00191068:
  return SUB41(uVar14,0);
}

Assistant:

bool ReadFDI(MemFile& file, std::shared_ptr<Disk>& disk)
{
    FDI_HEADER fh;
    if (!file.rewind() || !file.read(&fh, sizeof(fh)))
        return false;
    else if (memcmp(fh.abSignature, FDI_SIGNATURE, sizeof(fh.abSignature)))
        return false;

    int cyls = fh.bTracks[0];
    int heads = fh.bSides[0];
    Format::Validate(cyls, heads);

    auto data_pos = (fh.bDataOffset[1] << 8) | fh.bDataOffset[0];
    auto header_pos = static_cast<int>(sizeof(FDI_HEADER)) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);
    file.seek(header_pos);

    //  uint8_t* pbData = pb + fh.bDataOffset[0];
    //  auto pbHeaders = (uint8_t*)&fh.bExtraSize + sizeof(fh.bExtraSize) + ((fh.bExtraSize[1] << 8) | fh.bExtraSize[0]);

    for (auto cyl = 0; cyl < cyls; ++cyl)
    {
        for (auto head = 0; head < heads; ++head)
        {
            CylHead cylhead(cyl, head);
            Track track;

            FDI_TRACK ft;
            if (!file.read(&ft, sizeof(ft)))
                throw util::exception("short file reading ", cylhead);

            if (ft.sectors > MAX_SECTORS)
                throw util::exception(cylhead, " has too many sectors (", ft.sectors, ")");

            auto track_pos = data_pos + (/*(ft.abTrackOffset[3] << 24) |*/ (ft.abTrackOffset[2] << 16) |
                (ft.abTrackOffset[1] << 8) | ft.abTrackOffset[0]);

            for (int i = 0; i < ft.sectors; ++i)
            {
                FDI_SECTOR fs;
                if (!file.read(&fs, sizeof(fs)))
                    throw util::exception("short file reading ", cylhead, " sector index ", i);

                Sector sector(DataRate::_250K, Encoding::MFM, Header(fs.bTrack, fs.bSide, fs.bSector, fs.bSize));

                bool deleted_data = (fs.bFlags & 0x80) != 0;
                bool no_data = (fs.bFlags & 0x40) != 0;
                bool bad_data = true;   // until we learn otherwise
                uint8_t dam = deleted_data ? 0xf8 : 0xfb;

                auto old_pos = file.tell();
                auto sector_pos = track_pos + ((fs.bSectorOffset[1] << 8) | fs.bSectorOffset[0]);
                if (!file.seek(sector_pos))
                    throw util::exception("failed to seek to ", cylhead, " sector ", fs.bSector, " data @", sector_pos);

                // Use only 2 bits of the size, to match FD1793 behaviour
                uint8_t b1793Size = fs.bSize & 3;
                auto sector_size = Sector::SizeCodeToLength(b1793Size);

                Data data(sector_size); // always allocate full PC size, plus room for CRC
                file.read(data.data(), 1, static_cast<int>(data.size()));
                file.seek(old_pos);

                // Loop through valid size codes to check the flag bits
                for (uint8_t size = 0; !no_data && size <= 3; ++size)
                {
                    auto ssize = Sector::SizeCodeToLength(size);

                    // Does the size match the PC treatment of the size code?
                    if (ssize == Sector::SizeCodeToLength(fs.bSize))
                    {
                        // If the flags say no error, clear the data CRC error
                        if (fs.bFlags & (1 << size))
                            bad_data = false;
                    }
                    // Or is it within the current FD1793 size?
                    else if (size <= b1793Size)
                    {
                        CRC16 crc(CRC16::A1A1A1);
                        crc.add(dam);
                        crc.add(data.data(), ssize);

                        // If the size matches, there are no CRC bytes in the data
                        if (size == b1793Size)
                        {
                            // Do the flags indicate the CRC is good?
                            if (fs.bFlags & (1 << size))
                            {
                                // Add the calculated CRC bytes to to preserve the status
                                data.push_back(crc >> 8);
                                data.push_back(crc & 0xff);
                            }
                        }
                        else
                        {
                            // Continue reading into the data to check the CRC
                            crc.add(data.data() + ssize, 2);

                            // Ensure the CRC status matches the flags
                            if (!!(fs.bFlags & (1 << size)) != (crc ? 0 : 1))
                                Message(msgWarning, "inconsistent CRC flag for size=%d for %s", sector_size, CHR(cyl, head, fs.bSector));
                        }
                    }
                    else
                    {
                        // Skip clearing the flag so we warn any set bit below
                        continue;
                    }

                    // Reset the bit for this size, whether or not we used it
                    fs.bFlags &= ~(1 << size);
                }

                // Warn about any remaining flags, in case we're missing something
                if (fs.bFlags & ~0xc0)
                    Message(msgWarning, "unexpected flags (%02X) on %s", fs.bFlags, CHSR(cyl, head, i, fs.bSector));

                sector.add(std::move(data), bad_data, dam);
                track.add(std::move(sector));
            }

            disk->write(cylhead, std::move(track));
        }
    }

    auto desc_pos = (fh.bDescOffset[1] << 8) | fh.bDescOffset[0];
    if (desc_pos && file.seek(desc_pos))
    {
        // Read the comment block
        auto len = (data_pos > desc_pos) ? (data_pos - desc_pos) : 256;
        std::vector<char> comment(len);
        if (!file.read(comment))
            throw util::exception("short file reading comment");
        std::string str = std::string(comment.data(), comment.size());

        // To avoid confusion, don't store the default TDCVT comment
        if (str.substr(0, 29) != "\r\n'This file created by TDCVT" && str.substr(0, 3) != "FDI")
            disk->metadata["comment"] = str;
    }

    disk->strType = "FDI";
    return true;
}